

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgba.cpp
# Opt level: O0

uint16_t __thiscall Rgba::cgbColor(Rgba *this)

{
  bool bVar1;
  double *pdVar2;
  byte *pbVar3;
  double dVar4;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double g_adjusted;
  double b_linear;
  double g_linear;
  uint8_t b;
  uint8_t g;
  Rgba *pRStack_18;
  uint8_t r;
  Rgba *this_local;
  
  pRStack_18 = this;
  bVar1 = isTransparent(this);
  if (bVar1) {
    this_local._6_2_ = 0x8000;
  }
  else {
    bVar1 = isOpaque(this);
    if (!bVar1) {
      __assert_fail("isOpaque()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/rgba.cpp"
                    ,0x28,"uint16_t Rgba::cgbColor() const");
    }
    g_linear._7_1_ = this->red;
    g_linear._6_1_ = this->green;
    g_linear._5_1_ = this->blue;
    if ((options.useColorCurve & 1U) == 0) {
      g_linear._7_1_ = (byte)((int)(uint)g_linear._7_1_ >> 3);
      g_linear._6_1_ = (byte)((int)(uint)g_linear._6_1_ >> 3);
      g_linear._5_1_ = (byte)((int)(uint)g_linear._5_1_ >> 3);
    }
    else {
      b_linear = pow((double)g_linear._6_1_ / 255.0,2.2);
      g_adjusted = pow((double)g_linear._5_1_ / 255.0,2.2);
      local_40 = (b_linear * 4.0 - g_adjusted) / 3.0;
      local_48 = 0.0;
      local_50 = 1.0;
      pdVar2 = std::clamp<double>(&local_40,&local_48,&local_50);
      local_38 = *pdVar2;
      dVar4 = pow(local_38,0.45454545454545453);
      dVar4 = round(dVar4 * 255.0);
      g_linear._6_1_ = (byte)(int)dVar4;
      pbVar3 = std::array<unsigned_char,_256UL>::operator[](&reverse_curve,(ulong)g_linear._7_1_);
      g_linear._7_1_ = *pbVar3;
      pbVar3 = std::array<unsigned_char,_256UL>::operator[](&reverse_curve,(ulong)g_linear._6_1_);
      g_linear._6_1_ = *pbVar3;
      pbVar3 = std::array<unsigned_char,_256UL>::operator[](&reverse_curve,(ulong)g_linear._5_1_);
      g_linear._5_1_ = *pbVar3;
    }
    this_local._6_2_ =
         (ushort)g_linear._7_1_ | (ushort)g_linear._6_1_ << 5 | (ushort)g_linear._5_1_ << 10;
  }
  return this_local._6_2_;
}

Assistant:

uint16_t Rgba::cgbColor() const {
	if (isTransparent()) {
		return transparent;
	}
	assert(isOpaque());

	uint8_t r = red, g = green, b = blue;
	if (options.useColorCurve) {
		double g_linear = pow(g / 255.0, 2.2), b_linear = pow(b / 255.0, 2.2);
		double g_adjusted = std::clamp((g_linear * 4 - b_linear) / 3, 0.0, 1.0);
		g = round(pow(g_adjusted, 1 / 2.2) * 255);
		r = reverse_curve[r];
		g = reverse_curve[g];
		b = reverse_curve[b];
	} else {
		r >>= 3;
		g >>= 3;
		b >>= 3;
	}
	return r | g << 5 | b << 10;
}